

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O0

void __thiscall FThinkerList::AddTail(FThinkerList *this,DThinker *thinker)

{
  DThinker *pDVar1;
  bool bVar2;
  DThinker *tail;
  DThinker *thinker_local;
  FThinkerList *this_local;
  
  bVar2 = false;
  if (thinker->PrevThinker == (DThinker *)0x0) {
    bVar2 = thinker->NextThinker == (DThinker *)0x0;
  }
  if (!bVar2) {
    __assert_fail("thinker->PrevThinker == NULL && thinker->NextThinker == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                  ,0x43,"void FThinkerList::AddTail(DThinker *)");
  }
  if (((thinker->super_DObject).ObjectFlags & 0x20) != 0) {
    __assert_fail("!(thinker->ObjectFlags & OF_EuthanizeMe)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                  ,0x44,"void FThinkerList::AddTail(DThinker *)");
  }
  if (this->Sentinel == (DThinker *)0x0) {
    pDVar1 = (DThinker *)DObject::operator_new((DObject *)0x38,(size_t)thinker);
    DThinker::DThinker(pDVar1,NO_LINK);
    this->Sentinel = pDVar1;
    (this->Sentinel->super_DObject).ObjectFlags =
         (this->Sentinel->super_DObject).ObjectFlags | 0x400;
    this->Sentinel->NextThinker = this->Sentinel;
    this->Sentinel->PrevThinker = this->Sentinel;
    GC::WriteBarrier(&this->Sentinel->super_DObject);
  }
  pDVar1 = this->Sentinel->PrevThinker;
  if (pDVar1->NextThinker == this->Sentinel) {
    thinker->PrevThinker = pDVar1;
    thinker->NextThinker = this->Sentinel;
    pDVar1->NextThinker = thinker;
    this->Sentinel->PrevThinker = thinker;
    GC::WriteBarrier(&thinker->super_DObject,&pDVar1->super_DObject);
    GC::WriteBarrier(&thinker->super_DObject,&this->Sentinel->super_DObject);
    GC::WriteBarrier(&pDVar1->super_DObject,&thinker->super_DObject);
    GC::WriteBarrier(&this->Sentinel->super_DObject,&thinker->super_DObject);
    return;
  }
  __assert_fail("tail->NextThinker == Sentinel",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                ,0x4e,"void FThinkerList::AddTail(DThinker *)");
}

Assistant:

void FThinkerList::AddTail(DThinker *thinker)
{
	assert(thinker->PrevThinker == NULL && thinker->NextThinker == NULL);
	assert(!(thinker->ObjectFlags & OF_EuthanizeMe));
	if (Sentinel == NULL)
	{
		Sentinel = new DThinker(DThinker::NO_LINK);
		Sentinel->ObjectFlags |= OF_Sentinel;
		Sentinel->NextThinker = Sentinel;
		Sentinel->PrevThinker = Sentinel;
		GC::WriteBarrier(Sentinel);
	}
	DThinker *tail = Sentinel->PrevThinker;
	assert(tail->NextThinker == Sentinel);
	thinker->PrevThinker = tail;
	thinker->NextThinker = Sentinel;
	tail->NextThinker = thinker;
	Sentinel->PrevThinker = thinker;
	GC::WriteBarrier(thinker, tail);
	GC::WriteBarrier(thinker, Sentinel);
	GC::WriteBarrier(tail, thinker);
	GC::WriteBarrier(Sentinel, thinker);
}